

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  OutputDeclaration *pOVar1;
  Expression *pEVar2;
  WriteStream *pWVar3;
  pool_ptr<soul::heart::Expression> local_28;
  Module *local_18;
  WriteStream *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->newModule;
  local_18 = (Module *)__fn;
  old_local = (WriteStream *)this;
  pOVar1 = pool_ref::operator_cast_to_OutputDeclaration_((pool_ref *)(__fn + 0x20));
  pOVar1 = getRemappedOutput(this,pOVar1);
  local_28.object = *(Expression **)((long)&(local_18->shortName).field_2 + 8);
  cloneExpressionPtr((ModuleCloner *)&stack0xffffffffffffffe0,
                     (pool_ptr<soul::heart::Expression> *)this);
  pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18->fullName);
  pEVar2 = cloneExpression(this,pEVar2);
  pWVar3 = Module::
           allocate<soul::heart::WriteStream,soul::CodeLocation_const&,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Expression&>
                     (this_00,(CodeLocation *)(__fn + 8),pOVar1,
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffe0,pEVar2);
  pool_ptr<soul::heart::Expression>::~pool_ptr
            ((pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffe0);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_28);
  return (int)pWVar3;
}

Assistant:

heart::WriteStream& clone (const heart::WriteStream& old)
    {
        return newModule.allocate<heart::WriteStream> (old.location,
                                                       getRemappedOutput (old.target),
                                                       cloneExpressionPtr (old.element),
                                                       cloneExpression (old.value));
    }